

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::ModifyRepeatedExtensions(TestAllExtensionsLite *message)

{
  TestAllExtensionsLite *pTVar1;
  MutableType this;
  MutableType pTVar2;
  MutableType this_00;
  MutableType this_01;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  TestAllExtensionsLite *local_10;
  TestAllExtensionsLite *message_local;
  
  local_10 = message;
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,false>
            (message,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                      *)&proto2_unittest::repeated_int32_extension_lite,1,0x1f5);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_false>
                       *)proto2_unittest::repeated_int64_extension_lite,1,0x1f6);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_false>
                       *)&proto2_unittest::repeated_uint32_extension_lite,1,0x1f7);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_false>
                       *)proto2_unittest::repeated_uint64_extension_lite,1,0x1f8);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_false>
                       *)&proto2_unittest::repeated_sint32_extension_lite,1,0x1f9);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_false>
                       *)proto2_unittest::repeated_sint64_extension_lite,1,0x1fa);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_false>
                       *)&proto2_unittest::repeated_fixed32_extension_lite,1,0x1fb);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_false>
                       *)proto2_unittest::repeated_fixed64_extension_lite,1,0x1fc);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_false>
                       *)&proto2_unittest::repeated_sfixed32_extension_lite,1,0x1fd);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_false>
                       *)proto2_unittest::repeated_sfixed64_extension_lite,1,0x1fe);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_false>
                       *)&proto2_unittest::repeated_float_extension_lite,1,511.0);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_false>
                       *)proto2_unittest::repeated_double_extension_lite,1,512.0);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_false>
                       *)&proto2_unittest::repeated_bool_extension_lite,1,true);
  pTVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"515",&local_31);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (pTVar1,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                     *)proto2_unittest::repeated_string_extension_lite,1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pTVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"516",&local_69);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedStringTypeTraits,(unsigned_char)12,false>
            (pTVar1,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedStringTypeTraits,_(unsigned_char)__f_,_false>
                     *)proto2_unittest::repeated_bytes_extension_lite,1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  this = proto2_unittest::TestAllExtensionsLite::
         MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::RepeatedGroup_extension_lite>,(unsigned_char)10,false>
                   (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::RepeatedGroup_extension_lite>,_(unsigned_char)__n_,_false>
                              *)proto2_unittest::repeatedgroup_extension_lite,1);
  proto2_unittest::RepeatedGroup_extension_lite::set_a(this,0x205);
  pTVar2 = proto2_unittest::TestAllExtensionsLite::
           MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypesLite_NestedMessage>,(unsigned_char)11,false>
                     (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypesLite_NestedMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::repeated_nested_message_extension_lite,1);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar2,0x206);
  this_00 = proto2_unittest::TestAllExtensionsLite::
            MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::ForeignMessageLite>,(unsigned_char)11,false>
                      (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::ForeignMessageLite>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::repeated_foreign_message_extension_lite,1);
  proto2_unittest::ForeignMessageLite::set_c(this_00,0x207);
  this_01 = proto2_unittest::TestAllExtensionsLite::
            MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest_import::ImportMessageLite>,(unsigned_char)11,false>
                      (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest_import::ImportMessageLite>,_(unsigned_char)__v_,_false>
                                 *)proto2_unittest::repeated_import_message_extension_lite,1);
  proto2_unittest_import::ImportMessageLite::set_d(this_01,0x208);
  pTVar2 = proto2_unittest::TestAllExtensionsLite::
           MutableExtension<google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypesLite_NestedMessage>,(unsigned_char)11,false>
                     (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedMessageTypeTraits<proto2_unittest::TestAllTypesLite_NestedMessage>,_(unsigned_char)__v_,_false>
                                *)proto2_unittest::repeated_lazy_message_extension_lite,1);
  proto2_unittest::TestAllTypesLite_NestedMessage::set_bb(pTVar2,0x20f);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::TestAllTypesLite_NestedEnum>,(unsigned_char)14,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::TestAllTypesLite_NestedEnum>,_(unsigned_char)__x0e_,_false>
                       *)&proto2_unittest::repeated_nested_enum_extension_lite,1,
             TestAllTypesLite_NestedEnum_FOO);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,(unsigned_char)14,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_false>
                       *)&proto2_unittest::repeated_foreign_enum_extension_lite,1,FOREIGN_LITE_FOO);
  proto2_unittest::TestAllExtensionsLite::
  SetExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest_import::ImportEnumLite>,(unsigned_char)14,false>
            (local_10,(ExtensionIdentifier<proto2_unittest::TestAllExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest_import::ImportEnumLite>,_(unsigned_char)__x0e_,_false>
                       *)&proto2_unittest::repeated_import_enum_extension_lite,1,IMPORT_LITE_FOO);
  return;
}

Assistant:

void TestUtilLite::ModifyRepeatedExtensions(
    unittest::TestAllExtensionsLite* message) {
  message->SetExtension(unittest::repeated_int32_extension_lite, 1, 501);
  message->SetExtension(unittest::repeated_int64_extension_lite, 1, 502);
  message->SetExtension(unittest::repeated_uint32_extension_lite, 1, 503);
  message->SetExtension(unittest::repeated_uint64_extension_lite, 1, 504);
  message->SetExtension(unittest::repeated_sint32_extension_lite, 1, 505);
  message->SetExtension(unittest::repeated_sint64_extension_lite, 1, 506);
  message->SetExtension(unittest::repeated_fixed32_extension_lite, 1, 507);
  message->SetExtension(unittest::repeated_fixed64_extension_lite, 1, 508);
  message->SetExtension(unittest::repeated_sfixed32_extension_lite, 1, 509);
  message->SetExtension(unittest::repeated_sfixed64_extension_lite, 1, 510);
  message->SetExtension(unittest::repeated_float_extension_lite, 1, 511);
  message->SetExtension(unittest::repeated_double_extension_lite, 1, 512);
  message->SetExtension(unittest::repeated_bool_extension_lite, 1, true);
  message->SetExtension(unittest::repeated_string_extension_lite, 1, "515");
  message->SetExtension(unittest::repeated_bytes_extension_lite, 1, "516");

  message->MutableExtension(unittest::repeatedgroup_extension_lite, 1)
      ->set_a(517);
  message->MutableExtension(unittest::repeated_nested_message_extension_lite, 1)
      ->set_bb(518);
  message
      ->MutableExtension(unittest::repeated_foreign_message_extension_lite, 1)
      ->set_c(519);
  message->MutableExtension(unittest::repeated_import_message_extension_lite, 1)
      ->set_d(520);
  message->MutableExtension(unittest::repeated_lazy_message_extension_lite, 1)
      ->set_bb(527);

  message->SetExtension(unittest::repeated_nested_enum_extension_lite, 1,
                        unittest::TestAllTypesLite::FOO);
  message->SetExtension(unittest::repeated_foreign_enum_extension_lite, 1,
                        unittest::FOREIGN_LITE_FOO);
  message->SetExtension(unittest::repeated_import_enum_extension_lite, 1,
                        unittest_import::IMPORT_LITE_FOO);

}